

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double orient4dexact(double *pa,double *pb,double *pc,double *pd,double *pe,double aheight,
                    double bheight,double cheight,double dheight,double eheight)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int elen;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  undefined4 uVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dStack_8360;
  double dStack_8330;
  double dStack_82e0;
  double dStack_8260;
  double dStack_8220;
  double local_81f8;
  double dStack_81f0;
  double local_81e8;
  double local_81e0;
  double local_81d8;
  double dStack_81d0;
  double local_81c8;
  double local_81c0;
  double local_81b8;
  double dStack_81b0;
  double local_81a8;
  double local_81a0;
  undefined1 local_8198 [16];
  double local_8188;
  double local_8180;
  undefined1 local_8178 [16];
  double local_8168;
  double local_8160;
  double local_8158;
  double dStack_8150;
  double local_8148;
  double local_8140;
  double local_8138;
  double dStack_8130;
  double local_8128;
  double local_8120;
  double local_8118;
  double dStack_8110;
  double local_8108;
  double local_8100;
  double local_80f8;
  double dStack_80f0;
  double local_80e8;
  double local_80e0;
  double local_80d8;
  double dStack_80d0;
  double local_80c8;
  double local_80c0;
  double temp48b [48];
  double temp48a [48];
  double eac [24];
  double deb [24];
  double cda [24];
  double bce [24];
  double abd [24];
  double eab [24];
  double dea [24];
  double cde [24];
  double bcd [24];
  double abc [24];
  double temp8b [8];
  double temp8a [8];
  double temp16 [16];
  double ddet [192];
  double cdet [192];
  double bdet [192];
  double adet [192];
  double eabc [96];
  double deab [96];
  double cdea [96];
  double bcde [96];
  double abcd [96];
  double edet [192];
  double cddet [384];
  double abdet [384];
  double deter [960];
  double cdedet [576];
  
  dVar24 = *pb;
  dVar22 = pb[1];
  dVar59 = *pa;
  dVar57 = pa[1];
  dVar27 = dVar22 * dVar59;
  dVar39 = dVar24 * dVar57;
  dVar25 = splitter * dVar22 - (splitter * dVar22 - dVar22);
  dVar29 = splitter * dVar24 - (splitter * dVar24 - dVar24);
  dVar26 = splitter * dVar59 - (splitter * dVar59 - dVar59);
  dVar30 = splitter * dVar57 - (splitter * dVar57 - dVar57);
  dVar31 = dVar22 - dVar25;
  dVar36 = dVar24 - dVar29;
  dVar46 = dVar59 - dVar26;
  dVar47 = dVar57 - dVar30;
  dVar32 = dVar31 * dVar46 - (((dVar27 - dVar26 * dVar25) - dVar46 * dVar25) - dVar31 * dVar26);
  dVar37 = dVar36 * dVar47 - (((dVar39 - dVar29 * dVar30) - dVar36 * dVar30) - dVar47 * dVar29);
  dVar41 = dVar32 - dVar37;
  dVar21 = dVar27 + dVar41;
  dVar27 = (dVar27 - (dVar21 - (dVar21 - dVar27))) + (dVar41 - (dVar21 - dVar27));
  dVar28 = dVar27 - dVar39;
  dVar27 = (dVar27 - (dVar28 + (dVar27 - dVar28))) + ((dVar27 - dVar28) - dVar39);
  local_8178._8_4_ = SUB84(dVar27,0);
  local_8178._0_8_ = (dVar32 - (dVar41 + (dVar32 - dVar41))) + ((dVar32 - dVar41) - dVar37);
  local_8178._12_4_ = (int)((ulong)dVar27 >> 0x20);
  local_8160 = dVar21 + dVar28;
  local_8168 = (dVar21 - (local_8160 - (local_8160 - dVar21))) + (dVar28 - (local_8160 - dVar21));
  dVar63 = *pc;
  dVar62 = pc[1];
  dVar28 = splitter * dVar63 - (splitter * dVar63 - dVar63);
  dVar23 = splitter * dVar62 - (splitter * dVar62 - dVar62);
  dVar40 = *pd;
  dVar35 = pd[1];
  dVar54 = splitter * dVar35 - (splitter * dVar35 - dVar35);
  dVar55 = splitter * dVar40 - (splitter * dVar40 - dVar40);
  dVar26 = -dVar26;
  dVar29 = -dVar29;
  dVar32 = -dVar28;
  auVar6._8_4_ = SUB84(dVar55,0);
  auVar6._0_8_ = dVar32;
  auVar6._12_4_ = (uint)((ulong)dVar55 >> 0x20) ^ 0x80000000;
  dVar37 = dVar63 - dVar28;
  dVar41 = dVar62 - dVar23;
  uVar45 = (undefined4)((ulong)dVar41 >> 0x20);
  dVar33 = dVar35 - dVar54;
  dVar38 = dVar40 - dVar55;
  dVar27 = -dVar46;
  auVar1._8_4_ = SUB84(dVar36,0);
  auVar1._0_8_ = dVar27;
  auVar1._12_4_ = (int)((ulong)-dVar36 >> 0x20);
  dVar56 = -dVar37;
  dVar58 = -dVar38;
  dVar34 = dVar22 * dVar63;
  dVar39 = dVar24 * dVar62;
  dStack_82e0 = auVar6._8_8_;
  auVar3._8_4_ = SUB84(dVar41,0);
  auVar3._0_8_ = dVar37;
  auVar3._12_4_ = uVar45;
  dVar52 = dVar31 * dVar37 - (dVar32 * dVar31 + dVar56 * dVar25 + dVar32 * dVar25 + dVar34);
  dVar53 = dVar36 * dVar41 - (dVar41 * dVar29 + dVar23 * -dVar36 + dVar23 * dVar29 + dVar39);
  dVar49 = dVar53 - dVar52;
  dVar42 = dVar39 + dVar49;
  dVar39 = (dVar39 - (dVar42 - (dVar42 - dVar39))) + (dVar49 - (dVar42 - dVar39));
  dVar21 = dVar39 - dVar34;
  local_80d8 = (dVar53 - (dVar49 + (dVar53 - dVar49))) + ((dVar53 - dVar49) - dVar52);
  dStack_80d0 = (dVar39 - ((dVar39 - dVar21) + dVar21)) + ((dVar39 - dVar21) - dVar34);
  local_80c0 = dVar42 + dVar21;
  local_80c8 = (dVar42 - (local_80c0 - (local_80c0 - dVar42))) + (dVar21 - (local_80c0 - dVar42));
  dVar21 = dVar63 * dVar35;
  dVar52 = dVar62 * dVar40;
  dVar34 = dVar37 * dVar33 - (((dVar21 - dVar28 * dVar54) - dVar54 * dVar37) - dVar33 * dVar28);
  dVar42 = dVar41 * dVar38 - (((dVar52 - dVar55 * dVar23) - dVar23 * dVar38) - dVar41 * dVar55);
  dVar49 = dVar34 - dVar42;
  dVar39 = dVar21 + dVar49;
  dVar21 = (dVar21 - (dVar39 - (dVar39 - dVar21))) + (dVar49 - (dVar39 - dVar21));
  dVar28 = dVar21 - dVar52;
  local_80f8 = (dVar34 - (dVar49 + (dVar34 - dVar49))) + ((dVar34 - dVar49) - dVar42);
  dStack_80f0 = (dVar21 - (dVar28 + (dVar21 - dVar28))) + ((dVar21 - dVar28) - dVar52);
  local_80e0 = dVar39 + dVar28;
  local_80e8 = (dVar39 - (local_80e0 - (local_80e0 - dVar39))) + (dVar28 - (local_80e0 - dVar39));
  dVar34 = *pe;
  dVar42 = pe[1];
  dVar39 = splitter * dVar34 - (splitter * dVar34 - dVar34);
  dVar48 = splitter * dVar42 - (splitter * dVar42 - dVar42);
  dVar43 = -dVar39;
  dVar61 = dVar35 * dVar34;
  dVar21 = dVar40 * dVar42;
  dVar50 = dVar42 * dVar63;
  dVar51 = dVar34 * dVar62;
  dVar62 = dVar62 * dVar59;
  dVar63 = dVar63 * dVar57;
  dVar49 = dVar24 * dVar35;
  dVar53 = dVar22 * dVar40;
  dVar35 = dVar35 * dVar59;
  dVar40 = dVar40 * dVar57;
  dVar57 = dVar57 * dVar34;
  dVar59 = dVar59 * dVar42;
  dVar22 = dVar22 * dVar34;
  dVar24 = dVar24 * dVar42;
  dVar34 = dVar34 - dVar39;
  dVar42 = dVar42 - dVar48;
  dVar60 = -dVar34;
  dVar52 = dVar33 * dVar34 - (dVar43 * dVar33 + dVar60 * dVar54 + dVar43 * dVar54 + dVar61);
  dVar55 = dVar38 * dVar42 -
           (dVar42 * dStack_82e0 + dVar48 * dVar58 + dVar48 * dStack_82e0 + dVar21);
  dVar44 = dVar55 - dVar52;
  dVar28 = dVar21 + dVar44;
  dVar39 = (dVar21 - (dVar28 - (dVar28 - dVar21))) + (dVar44 - (dVar28 - dVar21));
  dVar21 = dVar39 - dVar61;
  dVar39 = (dVar39 - ((dVar39 - dVar21) + dVar21)) + ((dVar39 - dVar21) - dVar61);
  local_8198._8_4_ = SUB84(dVar39,0);
  local_8198._0_8_ = (dVar55 - (dVar44 + (dVar55 - dVar44))) + ((dVar55 - dVar44) - dVar52);
  local_8198._12_4_ = (int)((ulong)dVar39 >> 0x20);
  local_8180 = dVar28 + dVar21;
  local_8188 = (dVar28 - (local_8180 - (local_8180 - dVar28))) + (dVar21 - (local_8180 - dVar28));
  auVar4._8_4_ = SUB84(dVar30,0);
  auVar4._0_8_ = dVar54;
  auVar4._12_4_ = (int)((ulong)dVar30 >> 0x20);
  dStack_8220 = auVar1._8_8_;
  dVar55 = auVar3._8_8_;
  auVar2._8_4_ = SUB84(dVar41,0);
  auVar2._0_8_ = dVar42;
  auVar2._12_4_ = uVar45;
  auVar5._8_4_ = SUB84(dVar38 * dVar47,0);
  auVar5._0_8_ = dVar33 * dVar46;
  auVar5._12_4_ = (int)((ulong)(dVar38 * dVar47) >> 0x20);
  dVar39 = dVar47 * dVar34 - (dVar47 * dVar43 + dVar60 * dVar30 + dVar43 * dVar30 + dVar57);
  dVar21 = dVar46 * dVar42 - (dVar42 * dVar26 + dVar27 * dVar48 + dVar26 * dVar48 + dVar59);
  dVar28 = dVar39 - dVar21;
  dVar41 = dVar57 + dVar28;
  dVar57 = (dVar57 - (dVar41 - (dVar41 - dVar57))) + (dVar28 - (dVar41 - dVar57));
  dVar52 = dVar57 - dVar59;
  local_8118 = (dVar39 - (dVar28 + (dVar39 - dVar28))) + ((dVar39 - dVar28) - dVar21);
  dStack_8110 = (dVar57 - (dVar52 + (dVar57 - dVar52))) + ((dVar57 - dVar52) - dVar59);
  local_8100 = dVar41 + dVar52;
  local_8108 = (dVar41 - (local_8100 - (local_8100 - dVar41))) + (dVar52 - (local_8100 - dVar41));
  dVar59 = dVar55 * dVar46 - (dVar55 * dVar26 + dVar27 * dVar23 + dVar26 * dVar23 + dVar62);
  dVar57 = dVar37 * dVar47 - (dVar47 * dVar32 + dVar56 * dVar30 + dVar32 * dVar30 + dVar63);
  dVar21 = dVar59 - dVar57;
  dVar39 = dVar62 + dVar21;
  dVar28 = (dVar62 - (dVar39 - (dVar39 - dVar62))) + (dVar21 - (dVar39 - dVar62));
  dVar41 = dVar28 - dVar63;
  local_8138 = (dVar59 - (dVar21 + (dVar59 - dVar21))) + ((dVar59 - dVar21) - dVar57);
  dStack_8130 = (dVar28 - (dVar41 + (dVar28 - dVar41))) + ((dVar28 - dVar41) - dVar63);
  local_8120 = dVar39 + dVar41;
  local_8128 = (dVar39 - (local_8120 - (local_8120 - dVar39))) + (dVar41 - (local_8120 - dVar39));
  dVar59 = dVar36 * dVar33 - (dVar33 * dVar29 + dStack_8220 * dVar54 + dVar29 * dVar54 + dVar49);
  dVar57 = dVar31 * dVar38 -
           (dVar31 * dStack_82e0 + dVar58 * dVar25 + dStack_82e0 * dVar25 + dVar53);
  dVar21 = dVar59 - dVar57;
  dVar39 = dVar49 + dVar21;
  dVar28 = (dVar49 - (dVar39 - (dVar39 - dVar49))) + (dVar21 - (dVar39 - dVar49));
  dVar41 = dVar28 - dVar53;
  local_81b8 = (dVar59 - (dVar21 + (dVar59 - dVar21))) + ((dVar59 - dVar21) - dVar57);
  dStack_81b0 = (dVar28 - (dVar41 + (dVar28 - dVar41))) + ((dVar28 - dVar41) - dVar53);
  local_81a0 = dVar39 + dVar41;
  local_81a8 = (dVar39 - (local_81a0 - (local_81a0 - dVar39))) + (dVar41 - (local_81a0 - dVar39));
  dStack_8260 = auVar2._8_8_;
  dVar37 = dVar42 * dVar37 - (dVar42 * dVar32 + dVar56 * dVar48 + dVar32 * dVar48 + dVar50);
  dVar41 = dVar34 * dVar55 - (dStack_8260 * dVar43 + dVar60 * dVar23 + dVar43 * dVar23 + dVar51);
  dVar21 = dVar37 - dVar41;
  dVar39 = dVar50 + dVar21;
  dVar28 = (dVar50 - (dVar39 - (dVar39 - dVar50))) + (dVar21 - (dVar39 - dVar50));
  dVar32 = dVar28 - dVar51;
  local_81d8 = (dVar37 - (dVar21 + (dVar37 - dVar21))) + ((dVar37 - dVar21) - dVar41);
  dStack_81d0 = (dVar28 - (dVar32 + (dVar28 - dVar32))) + ((dVar28 - dVar32) - dVar51);
  local_81c0 = dVar39 + dVar32;
  local_81c8 = (dVar39 - (local_81c0 - (local_81c0 - dVar39))) + (dVar32 - (local_81c0 - dVar39));
  dStack_8330 = auVar4._8_8_;
  dStack_8360 = auVar5._8_8_;
  dVar27 = dVar33 * dVar46 - (dVar33 * dVar26 + dVar27 * dVar54 + dVar26 * dVar54 + dVar35);
  dStack_8360 = dStack_8360 -
                (dVar47 * dStack_82e0 + dVar58 * dStack_8330 + dStack_82e0 * dStack_8330 + dVar40);
  dVar32 = dStack_8360 - dVar27;
  dVar28 = dVar40 + dVar32;
  dVar39 = (dVar40 - (dVar28 - (dVar28 - dVar40))) + (dVar32 - (dVar28 - dVar40));
  dVar21 = dVar39 - dVar35;
  local_8158 = (dStack_8360 - (dVar32 + (dStack_8360 - dVar32))) + ((dStack_8360 - dVar32) - dVar27)
  ;
  dStack_8150 = (dVar39 - ((dVar39 - dVar21) + dVar21)) + ((dVar39 - dVar21) - dVar35);
  local_8140 = dVar28 + dVar21;
  local_8148 = (dVar28 - (local_8140 - (local_8140 - dVar28))) + (dVar21 - (local_8140 - dVar28));
  dVar32 = dVar34 * dVar31 - (dVar31 * dVar43 + dVar60 * dVar25 + dVar43 * dVar25 + dVar22);
  dVar37 = dVar42 * dVar36 - (dVar42 * dVar29 + dStack_8220 * dVar48 + dVar29 * dVar48 + dVar24);
  dVar28 = dVar32 - dVar37;
  dVar27 = dVar22 + dVar28;
  dVar39 = (dVar22 - (dVar27 - (dVar27 - dVar22))) + (dVar28 - (dVar27 - dVar22));
  dVar21 = dVar39 - dVar24;
  local_81f8 = (dVar32 - (dVar28 + (dVar32 - dVar28))) + ((dVar32 - dVar28) - dVar37);
  dStack_81f0 = (dVar39 - (dVar21 + (dVar39 - dVar21))) + ((dVar39 - dVar21) - dVar24);
  local_81e0 = dVar27 + dVar21;
  local_81e8 = (dVar27 - (local_81e0 - (local_81e0 - dVar27))) + (dVar21 - (local_81e0 - dVar27));
  dVar27 = pa[2];
  iVar7 = scale_expansion_zeroelim(4,&local_80d8,dVar27,temp8a);
  dVar39 = pb[2];
  iVar8 = scale_expansion_zeroelim(4,&local_8138,-dVar39,temp8b);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,temp8a,iVar8,temp8b,temp16);
  dVar21 = pc[2];
  iVar8 = scale_expansion_zeroelim(4,(double *)local_8178,dVar21,temp8a);
  iVar7 = fast_expansion_sum_zeroelim(iVar8,temp8a,iVar7,temp16,abc);
  iVar8 = scale_expansion_zeroelim(4,&local_80f8,dVar39,temp8a);
  iVar9 = scale_expansion_zeroelim(4,&local_81b8,-dVar21,temp8b);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,temp8a,iVar9,temp8b,temp16);
  dVar28 = pd[2];
  iVar9 = scale_expansion_zeroelim(4,&local_80d8,dVar28,temp8a);
  iVar8 = fast_expansion_sum_zeroelim(iVar9,temp8a,iVar8,temp16,bcd);
  iVar9 = scale_expansion_zeroelim(4,(double *)local_8198,dVar21,temp8a);
  iVar10 = scale_expansion_zeroelim(4,&local_81d8,-dVar28,temp8b);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,temp8a,iVar10,temp8b,temp16);
  dVar32 = pe[2];
  iVar10 = scale_expansion_zeroelim(4,&local_80f8,dVar32,temp8a);
  iVar9 = fast_expansion_sum_zeroelim(iVar10,temp8a,iVar9,temp16,cde);
  iVar10 = scale_expansion_zeroelim(4,&local_8118,dVar28,temp8a);
  iVar11 = scale_expansion_zeroelim(4,&local_8158,-dVar32,temp8b);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,temp8a,iVar11,temp8b,temp16);
  iVar11 = scale_expansion_zeroelim(4,(double *)local_8198,dVar27,temp8a);
  iVar10 = fast_expansion_sum_zeroelim(iVar11,temp8a,iVar10,temp16,dea);
  iVar11 = scale_expansion_zeroelim(4,(double *)local_8178,dVar32,temp8a);
  iVar12 = scale_expansion_zeroelim(4,&local_81f8,-dVar27,temp8b);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,temp8a,iVar12,temp8b,temp16);
  iVar12 = scale_expansion_zeroelim(4,&local_8118,dVar39,temp8a);
  iVar11 = fast_expansion_sum_zeroelim(iVar12,temp8a,iVar11,temp16,eab);
  iVar12 = scale_expansion_zeroelim(4,&local_81b8,dVar27,temp8a);
  iVar13 = scale_expansion_zeroelim(4,&local_8158,dVar39,temp8b);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,temp8a,iVar13,temp8b,temp16);
  iVar13 = scale_expansion_zeroelim(4,(double *)local_8178,dVar28,temp8a);
  iVar12 = fast_expansion_sum_zeroelim(iVar13,temp8a,iVar12,temp16,abd);
  iVar13 = scale_expansion_zeroelim(4,&local_81d8,dVar39,temp8a);
  iVar14 = scale_expansion_zeroelim(4,&local_81f8,dVar21,temp8b);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,temp8a,iVar14,temp8b,temp16);
  iVar14 = scale_expansion_zeroelim(4,&local_80d8,dVar32,temp8a);
  iVar13 = fast_expansion_sum_zeroelim(iVar14,temp8a,iVar13,temp16,bce);
  iVar14 = scale_expansion_zeroelim(4,&local_8158,dVar21,temp8a);
  iVar15 = scale_expansion_zeroelim(4,&local_8138,dVar28,temp8b);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,temp8a,iVar15,temp8b,temp16);
  iVar15 = scale_expansion_zeroelim(4,&local_80f8,dVar27,temp8a);
  iVar14 = fast_expansion_sum_zeroelim(iVar15,temp8a,iVar14,temp16,cda);
  iVar15 = scale_expansion_zeroelim(4,&local_81f8,dVar28,temp8a);
  iVar16 = scale_expansion_zeroelim(4,&local_81b8,dVar32,temp8b);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,temp8a,iVar16,temp8b,temp16);
  iVar16 = scale_expansion_zeroelim(4,(double *)local_8198,dVar39,temp8a);
  iVar15 = fast_expansion_sum_zeroelim(iVar16,temp8a,iVar15,temp16,deb);
  iVar16 = scale_expansion_zeroelim(4,&local_8138,dVar32,temp8a);
  iVar17 = scale_expansion_zeroelim(4,&local_81d8,dVar27,temp8b);
  iVar16 = fast_expansion_sum_zeroelim(iVar16,temp8a,iVar17,temp8b,temp16);
  iVar17 = scale_expansion_zeroelim(4,&local_8118,dVar21,temp8a);
  iVar16 = fast_expansion_sum_zeroelim(iVar17,temp8a,iVar16,temp16,eac);
  iVar17 = fast_expansion_sum_zeroelim(iVar9,cde,iVar13,bce,temp48a);
  uVar18 = fast_expansion_sum_zeroelim(iVar15,deb,iVar8,bcd,temp48b);
  uVar19 = 0;
  uVar20 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar20 = uVar19;
  }
  for (; uVar20 != uVar19; uVar19 = uVar19 + 1) {
    temp48b[uVar19] = -temp48b[uVar19];
  }
  iVar17 = fast_expansion_sum_zeroelim(iVar17,temp48a,uVar18,temp48b,bcde);
  iVar17 = scale_expansion_zeroelim(iVar17,bcde,aheight,adet);
  elen = fast_expansion_sum_zeroelim(iVar10,dea,iVar14,cda,temp48a);
  uVar18 = fast_expansion_sum_zeroelim(iVar16,eac,iVar9,cde,temp48b);
  uVar19 = 0;
  uVar20 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar20 = uVar19;
  }
  for (; uVar20 != uVar19; uVar19 = uVar19 + 1) {
    temp48b[uVar19] = -temp48b[uVar19];
  }
  iVar9 = fast_expansion_sum_zeroelim(elen,temp48a,uVar18,temp48b,cdea);
  iVar9 = scale_expansion_zeroelim(iVar9,cdea,bheight,bdet);
  iVar15 = fast_expansion_sum_zeroelim(iVar11,eab,iVar15,deb,temp48a);
  uVar18 = fast_expansion_sum_zeroelim(iVar12,abd,iVar10,dea,temp48b);
  uVar19 = 0;
  uVar20 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar20 = uVar19;
  }
  for (; uVar20 != uVar19; uVar19 = uVar19 + 1) {
    temp48b[uVar19] = -temp48b[uVar19];
  }
  iVar10 = fast_expansion_sum_zeroelim(iVar15,temp48a,uVar18,temp48b,deab);
  iVar10 = scale_expansion_zeroelim(iVar10,deab,cheight,cdet);
  iVar15 = fast_expansion_sum_zeroelim(iVar7,abc,iVar16,eac,temp48a);
  uVar18 = fast_expansion_sum_zeroelim(iVar13,bce,iVar11,eab,temp48b);
  uVar19 = 0;
  uVar20 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar20 = uVar19;
  }
  for (; uVar20 != uVar19; uVar19 = uVar19 + 1) {
    temp48b[uVar19] = -temp48b[uVar19];
  }
  iVar11 = fast_expansion_sum_zeroelim(iVar15,temp48a,uVar18,temp48b,eabc);
  iVar11 = scale_expansion_zeroelim(iVar11,eabc,dheight,ddet);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,bcd,iVar12,abd,temp48a);
  uVar18 = fast_expansion_sum_zeroelim(iVar14,cda,iVar7,abc,temp48b);
  uVar19 = 0;
  uVar20 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar20 = uVar19;
  }
  for (; uVar20 != uVar19; uVar19 = uVar19 + 1) {
    temp48b[uVar19] = -temp48b[uVar19];
  }
  iVar7 = fast_expansion_sum_zeroelim(iVar8,temp48a,uVar18,temp48b,abcd);
  iVar7 = scale_expansion_zeroelim(iVar7,abcd,eheight,edet);
  iVar8 = fast_expansion_sum_zeroelim(iVar17,adet,iVar9,bdet,abdet);
  iVar9 = fast_expansion_sum_zeroelim(iVar10,cdet,iVar11,ddet,cddet);
  iVar7 = fast_expansion_sum_zeroelim(iVar9,cddet,iVar7,edet,cdedet);
  iVar7 = fast_expansion_sum_zeroelim(iVar8,abdet,iVar7,cdedet,deter);
  return abdet[(long)iVar7 + 0x17f];
}

Assistant:

REAL orient4dexact(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe,
                   REAL aheight, REAL bheight, REAL cheight, REAL dheight, 
                   REAL eheight)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxey1, exay1;
  INEXACT REAL bxay1, cxby1, dxcy1, exdy1, axey1;
  INEXACT REAL axcy1, bxdy1, cxey1, dxay1, exby1;
  INEXACT REAL cxay1, dxby1, excy1, axdy1, bxey1;
  REAL axby0, bxcy0, cxdy0, dxey0, exay0;
  REAL bxay0, cxby0, dxcy0, exdy0, axey0;
  REAL axcy0, bxdy0, cxey0, dxay0, exby0;
  REAL cxay0, dxby0, excy0, axdy0, bxey0;
  REAL ab[4], bc[4], cd[4], de[4], ea[4];
  REAL ac[4], bd[4], ce[4], da[4], eb[4];
  REAL temp8a[8], temp8b[8], temp16[16];
  int temp8alen, temp8blen, temp16len;
  REAL abc[24], bcd[24], cde[24], dea[24], eab[24];
  REAL abd[24], bce[24], cda[24], deb[24], eac[24];
  int abclen, bcdlen, cdelen, dealen, eablen;
  int abdlen, bcelen, cdalen, deblen, eaclen;
  REAL temp48a[48], temp48b[48];
  int temp48alen, temp48blen;
  REAL abcd[96], bcde[96], cdea[96], deab[96], eabc[96];
  int abcdlen, bcdelen, cdealen, deablen, eabclen;
  REAL adet[192], bdet[192], cdet[192], ddet[192], edet[192];
  int alen, blen, clen, dlen, elen;
  REAL abdet[384], cddet[384], cdedet[576];
  int ablen, cdlen;
  REAL deter[960];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pe[1], dxey1, dxey0);
  Two_Product(pe[0], pd[1], exdy1, exdy0);
  Two_Two_Diff(dxey1, dxey0, exdy1, exdy0, de[3], de[2], de[1], de[0]);

  Two_Product(pe[0], pa[1], exay1, exay0);
  Two_Product(pa[0], pe[1], axey1, axey0);
  Two_Two_Diff(exay1, exay0, axey1, axey0, ea[3], ea[2], ea[1], ea[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  Two_Product(pc[0], pe[1], cxey1, cxey0);
  Two_Product(pe[0], pc[1], excy1, excy0);
  Two_Two_Diff(cxey1, cxey0, excy1, excy0, ce[3], ce[2], ce[1], ce[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pe[0], pb[1], exby1, exby0);
  Two_Product(pb[0], pe[1], bxey1, bxey0);
  Two_Two_Diff(exby1, exby0, bxey1, bxey0, eb[3], eb[2], eb[1], eb[0]);

  temp8alen = scale_expansion_zeroelim(4, bc, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pc[2], temp8a);
  abclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abc);

  temp8alen = scale_expansion_zeroelim(4, cd, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pd[2], temp8a);
  bcdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bcd);

  temp8alen = scale_expansion_zeroelim(4, de, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, -pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pe[2], temp8a);
  cdelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cde);

  temp8alen = scale_expansion_zeroelim(4, ea, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, -pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pa[2], temp8a);
  dealen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       dea);

  temp8alen = scale_expansion_zeroelim(4, ab, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, -pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pb[2], temp8a);
  eablen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eab);

  temp8alen = scale_expansion_zeroelim(4, bd, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pd[2], temp8a);
  abdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abd);

  temp8alen = scale_expansion_zeroelim(4, ce, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pe[2], temp8a);
  bcelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bce);

  temp8alen = scale_expansion_zeroelim(4, da, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pa[2], temp8a);
  cdalen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cda);

  temp8alen = scale_expansion_zeroelim(4, eb, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pb[2], temp8a);
  deblen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       deb);

  temp8alen = scale_expansion_zeroelim(4, ac, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pc[2], temp8a);
  eaclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eac);

  temp48alen = fast_expansion_sum_zeroelim(cdelen, cde, bcelen, bce, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(deblen, deb, bcdlen, bcd, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  bcdelen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, bcde);
  alen = scale_expansion_zeroelim(bcdelen, bcde, aheight, adet);

  temp48alen = fast_expansion_sum_zeroelim(dealen, dea, cdalen, cda, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(eaclen, eac, cdelen, cde, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  cdealen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, cdea);
  blen = scale_expansion_zeroelim(cdealen, cdea, bheight, bdet);

  temp48alen = fast_expansion_sum_zeroelim(eablen, eab, deblen, deb, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(abdlen, abd, dealen, dea, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  deablen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, deab);
  clen = scale_expansion_zeroelim(deablen, deab, cheight, cdet);

  temp48alen = fast_expansion_sum_zeroelim(abclen, abc, eaclen, eac, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(bcelen, bce, eablen, eab, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  eabclen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, eabc);
  dlen = scale_expansion_zeroelim(eabclen, eabc, dheight, ddet);

  temp48alen = fast_expansion_sum_zeroelim(bcdlen, bcd, abdlen, abd, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(cdalen, cda, abclen, abc, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  abcdlen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, abcd);
  elen = scale_expansion_zeroelim(abcdlen, abcd, eheight, edet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  cdelen = fast_expansion_sum_zeroelim(cdlen, cddet, elen, edet, cdedet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdelen, cdedet, deter);

  return deter[deterlen - 1];
}